

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_pair_set_key(fy_node_pair *fynp,fy_node *fyn)

{
  fy_node *fyn_00;
  _Bool _Var1;
  fy_node_pair *pfVar2;
  
  if (fynp == (fy_node_pair *)0x0) {
    return -1;
  }
  if ((fyn != (fy_node *)0x0) && ((fyn->field_0x34 & 8) != 0)) {
    return -1;
  }
  fyn_00 = fynp->parent;
  if (fyn_00 == (fy_node *)0x0) {
    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;
  }
  else {
    if ((fyn_00->field_0x34 & 3) != 2) {
      return -1;
    }
    if (fyn_00->xl == (fy_accel *)0x0) {
      pfVar2 = (fy_node_pair *)&fyn_00->field_12;
      while( true ) {
        pfVar2 = (fy_node_pair *)(pfVar2->node).next;
        if (pfVar2 == (fy_node_pair *)&fyn_00->field_12) {
          pfVar2 = (fy_node_pair *)0x0;
        }
        if (pfVar2 == (fy_node_pair *)0x0) break;
        if ((pfVar2 != fynp) && (_Var1 = fy_node_compare(pfVar2->key,fyn), _Var1)) {
          return -1;
        }
      }
    }
    else {
      pfVar2 = fy_node_accel_lookup_by_node(fyn_00,fyn);
      if (pfVar2 != (fy_node_pair *)0x0 && pfVar2 != fynp) {
        return -1;
      }
      fy_accel_remove(fyn_00->xl,fynp->key);
    }
    fy_node_mark_synthetic(fyn_00);
    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;
    if (fyn_00->xl != (fy_accel *)0x0) {
      fy_accel_insert(fyn_00->xl,fyn,fynp);
    }
  }
  fyn->field_0x34 = fyn->field_0x34 | 8;
  return 0;
}

Assistant:

int fy_node_pair_set_key(struct fy_node_pair *fynp, struct fy_node *fyn) {
    struct fy_node *fyn_map;
    struct fy_node_pair *fynpi;

    if (!fynp)
        return -1;

    /* the node must not be attached */
    if (fyn && fyn->attached)
        return -1;

    /* sanity check and duplication check */
    fyn_map = fynp->parent;
    if (fyn_map) {

        /* (in)sanity check */
        if (!fy_node_is_mapping(fyn_map))
            return -1;

        if (fyn_map->xl) {
            /* either we're already on the parent list (and it's OK) */
            /* or we're not and we have a duplicate key */
            fynpi = fy_node_accel_lookup_by_node(fyn_map, fyn);
            if (fynpi && fynpi != fynp)
                return -1;
            /* remove that key */
            fy_accel_remove(fyn_map->xl, fynp->key);
        } else {
            /* check whether the key is a duplicate
			* skipping ourselves since our key gets replaced
			*/
            for (fynpi = fy_node_pair_list_head(&fyn_map->mapping); fynpi;
                 fynpi = fy_node_pair_next(&fyn_map->mapping, fynpi)) {

                if (fynpi != fynp && fy_node_compare(fynpi->key, fyn))
                    return -1;
            }
        }

        fy_node_mark_synthetic(fyn_map);
    }

    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;

    if (fyn_map && fyn_map->xl)
        fy_accel_insert(fyn_map->xl, fynp->key, fynp);

    fyn->attached = true;

    return 0;
}